

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_x,float default_y)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow *window;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pIVar3 = GImGui;
  fVar8 = size.x;
  fVar5 = size.y;
  if (0.0 <= fVar8) {
    fVar4 = 0.0;
    fVar6 = 0.0;
    if (0.0 <= fVar5) goto LAB_00130687;
  }
  pIVar2 = GImGui->CurrentWindow;
  IVar1 = (pIVar2->ContentsRegionRect).Max;
  fVar4 = IVar1.x;
  if ((pIVar2->DC).ColumnsCount != 1) {
    fVar4 = GetColumnOffset((pIVar2->DC).ColumnsCurrent + 1);
    fVar4 = fVar4 - (pIVar2->WindowPadding).x;
  }
  fVar4 = (pIVar2->Pos).x + fVar4;
  fVar6 = IVar1.y + (pIVar2->Pos).y;
LAB_00130687:
  fVar7 = fVar8;
  if ((fVar8 <= 0.0) && ((fVar8 != 0.0 || (fVar7 = default_x, NAN(fVar8))))) {
    fVar4 = fVar4 - (pIVar3->CurrentWindow->DC).CursorPos.x;
    if (fVar4 <= 4.0) {
      fVar4 = 4.0;
    }
    fVar7 = fVar4 + fVar8;
  }
  fVar8 = fVar5;
  if ((fVar5 <= 0.0) && ((fVar5 != 0.0 || (fVar8 = default_y, NAN(fVar5))))) {
    fVar6 = fVar6 - (pIVar3->CurrentWindow->DC).CursorPos.y;
    if (fVar6 <= 4.0) {
      fVar6 = 4.0;
    }
    fVar8 = fVar5 + fVar6;
  }
  IVar1.y = fVar8;
  IVar1.x = fVar7;
  return IVar1;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_x, float default_y)
{
    ImGuiContext& g = *GImGui;
    ImVec2 content_max;
    if (size.x < 0.0f || size.y < 0.0f)
        content_max = g.CurrentWindow->Pos + GetContentRegionMax();
    if (size.x <= 0.0f)
        size.x = (size.x == 0.0f) ? default_x : ImMax(content_max.x - g.CurrentWindow->DC.CursorPos.x, 4.0f) + size.x;
    if (size.y <= 0.0f)
        size.y = (size.y == 0.0f) ? default_y : ImMax(content_max.y - g.CurrentWindow->DC.CursorPos.y, 4.0f) + size.y;
    return size;
}